

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.h
# Opt level: O1

void __thiscall
pstack::Elf::GnuHash::GnuHash(GnuHash *this,csptr *hash_,csptr *syms_,csptr *strings_)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined1 auStack_38 [8];
  Header t;
  
  (this->hash).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (hash_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->hash).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (hash_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
  (hash_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->hash).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  (hash_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (this->syms).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (syms_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->syms).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (syms_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
  (syms_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->syms).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  (syms_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (this->strings).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (strings_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->strings).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (strings_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (strings_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->strings).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  (strings_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  Reader::readObj<pstack::Elf::GnuHash::Header>
            ((this->hash).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,0,(Header *)auStack_38,1);
  (this->header).nbuckets = auStack_38._0_4_;
  (this->header).symoffset = auStack_38._4_4_;
  (this->header).bloom_size = t.nbuckets;
  (this->header).bloom_shift = t.symoffset;
  return;
}

Assistant:

GnuHash(Reader::csptr hash_, Reader::csptr syms_, Reader::csptr strings_)
        : hash(std::move(hash_))
        , syms(std::move(syms_))
        , strings(std::move(strings_))
        , header(hash->readObj<Header>(0))
        {}